

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom.cpp
# Opt level: O1

void __thiscall CRollingBloomFilter::reset(CRollingBloomFilter *this)

{
  pointer __s;
  pointer puVar1;
  uint64_t uVar2;
  long in_FS_OFFSET;
  FastRandomContext local_a0;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  FastRandomContext::FastRandomContext(&local_a0,false);
  uVar2 = RandomMixin<FastRandomContext>::randbits<32>
                    (&local_a0.super_RandomMixin<FastRandomContext>);
  this->nTweak = (uint)uVar2;
  ChaCha20::~ChaCha20(&local_a0.rng);
  this->nEntriesThisGeneration = 0;
  this->nGeneration = 1;
  __s = (this->data).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start;
  puVar1 = (this->data).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (__s != puVar1) {
    memset(__s,0,((long)puVar1 + (-8 - (long)__s) & 0xfffffffffffffff8U) + 8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CRollingBloomFilter::reset()
{
    nTweak = FastRandomContext().rand<unsigned int>();
    nEntriesThisGeneration = 0;
    nGeneration = 1;
    std::fill(data.begin(), data.end(), 0);
}